

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicorn_common.h
# Opt level: O2

MemoryRegion * find_memory_mapping_sparc64(uc_struct_conflict8 *uc,hwaddr address)

{
  MemoryRegion *pMVar1;
  hwaddr len;
  hwaddr xlat;
  hwaddr local_20 [2];
  
  local_20[1] = 0;
  local_20[0] = 1;
  pMVar1 = flatview_translate_sparc64
                     ((uc_struct_conflict9 *)(uc->address_space_memory).uc,
                      (uc->address_space_memory).current_map,address,local_20 + 1,local_20,false,
                      (MemTxAttrs)0x1);
  if (pMVar1 == &uc->io_mem_unassigned) {
    pMVar1 = (MemoryRegion *)0x0;
  }
  return pMVar1;
}

Assistant:

MemoryRegion *find_memory_mapping(struct uc_struct *uc, hwaddr address)
{
    hwaddr xlat = 0;
    hwaddr len = 1;
    MemoryRegion *mr = address_space_translate(&uc->address_space_memory, address, &xlat, &len, false, MEMTXATTRS_UNSPECIFIED);

    if (mr == &uc->io_mem_unassigned) {
        return NULL;
    }
    return mr;
}